

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::extend<2ul,unsigned_int,unsigned_long,(wasm::LaneOrder)0>
          (Literal *__return_storage_ptr__,wasm *this,Literal *vec)

{
  uint uVar1;
  long lVar2;
  anon_union_16_6_1532cd5a_for_Literal_0 *this_00;
  undefined1 local_d8 [8];
  LaneArray<2UL_*_2> lanes;
  LaneArray<2UL> result;
  anon_union_16_6_1532cd5a_for_Literal_0 local_40;
  undefined8 local_30;
  
  getLanes<unsigned_int,4>((LaneArray<4> *)local_d8,this,vec);
  lanes._M_elems[3].type.id = 0;
  for (lVar2 = 0; lVar2 != 0x30; lVar2 = lVar2 + 0x18) {
    uVar1 = Literal::geti32((Literal *)(local_d8 + lVar2));
    local_40.i64 = (int64_t)uVar1;
    local_30 = 3;
    this_00 = (anon_union_16_6_1532cd5a_for_Literal_0 *)((long)&lanes._M_elems[3].type.id + lVar2);
    if (this_00 != &local_40) {
      Literal::~Literal((Literal *)&this_00->func);
      Literal::Literal((Literal *)&this_00->func,(Literal *)&local_40.func);
    }
    Literal::~Literal((Literal *)&local_40.func);
  }
  Literal::Literal(__return_storage_ptr__,(LaneArray<2> *)&lanes._M_elems[3].type);
  std::array<wasm::Literal,_2UL>::~array((array<wasm::Literal,_2UL> *)&lanes._M_elems[3].type);
  std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)local_d8);
  return __return_storage_ptr__;
}

Assistant:

Literal extend(const Literal& vec) {
  LaneArray<Lanes* 2> lanes = getLanes<LaneFrom, Lanes * 2>(vec);
  LaneArray<Lanes> result;
  for (size_t i = 0; i < Lanes; ++i) {
    size_t idx = (Side == LaneOrder::Low) ? i : i + Lanes;
    result[i] = Literal((LaneTo)(LaneFrom)lanes[idx].geti32());
  }
  return Literal(result);
}